

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O3

int cm_zlib_deflateCopy(z_streamp dest,z_streamp source)

{
  internal_state *__src;
  int iVar1;
  internal_state *__dest;
  Bytef *pBVar2;
  Posf *pPVar3;
  int iVar4;
  
  iVar1 = deflateStateCheck(source);
  iVar4 = -2;
  if ((dest != (z_streamp)0x0) && (iVar1 == 0)) {
    __src = source->state;
    memcpy(dest,source,0x70);
    __dest = (internal_state *)(*dest->zalloc)(dest->opaque,1,0x1740);
    iVar4 = -4;
    if (__dest != (internal_state *)0x0) {
      dest->state = __dest;
      memcpy(__dest,__src,0x1740);
      __dest->strm = dest;
      pBVar2 = (Bytef *)(*dest->zalloc)(dest->opaque,__dest->w_size,2);
      __dest->window = pBVar2;
      pPVar3 = (Posf *)(*dest->zalloc)(dest->opaque,__dest->w_size,2);
      __dest->prev = pPVar3;
      pPVar3 = (Posf *)(*dest->zalloc)(dest->opaque,__dest->hash_size,2);
      __dest->head = pPVar3;
      pBVar2 = (Bytef *)(*dest->zalloc)(dest->opaque,__dest->lit_bufsize,4);
      __dest->pending_buf = pBVar2;
      if (((__dest->window == (Bytef *)0x0) || (__dest->prev == (Posf *)0x0)) ||
         (pBVar2 == (Bytef *)0x0 || __dest->head == (Posf *)0x0)) {
        cm_zlib_deflateEnd(dest);
      }
      else {
        memcpy(__dest->window,__src->window,(ulong)(__dest->w_size * 2));
        memcpy(__dest->prev,__src->prev,(ulong)__dest->w_size * 2);
        memcpy(__dest->head,__src->head,(ulong)__dest->hash_size * 2);
        memcpy(__dest->pending_buf,__src->pending_buf,(ulong)(__dest->lit_bufsize << 2));
        __dest->pending_out =
             __dest->pending_buf + ((long)__src->pending_out - (long)__src->pending_buf);
        __dest->sym_buf = __dest->pending_buf + __dest->lit_bufsize;
        (__dest->l_desc).dyn_tree = __dest->dyn_ltree;
        (__dest->d_desc).dyn_tree = __dest->dyn_dtree;
        (__dest->bl_desc).dyn_tree = __dest->bl_tree;
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

int ZEXPORT deflateCopy(z_streamp dest, z_streamp source) {
#ifdef MAXSEG_64K
    (void)dest;
    (void)source;
    return Z_STREAM_ERROR;
#else
    deflate_state *ds;
    deflate_state *ss;


    if (deflateStateCheck(source) || dest == Z_NULL) {
        return Z_STREAM_ERROR;
    }

    ss = source->state;

    zmemcpy((voidpf)dest, (voidpf)source, sizeof(z_stream));

    ds = (deflate_state *) ZALLOC(dest, 1, sizeof(deflate_state));
    if (ds == Z_NULL) return Z_MEM_ERROR;
    dest->state = (struct internal_state FAR *) ds;
    zmemcpy((voidpf)ds, (voidpf)ss, sizeof(deflate_state));
    ds->strm = dest;

    ds->window = (Bytef *) ZALLOC(dest, ds->w_size, 2*sizeof(Byte));
    ds->prev   = (Posf *)  ZALLOC(dest, ds->w_size, sizeof(Pos));
    ds->head   = (Posf *)  ZALLOC(dest, ds->hash_size, sizeof(Pos));
    ds->pending_buf = (uchf *) ZALLOC(dest, ds->lit_bufsize, LIT_BUFS);

    if (ds->window == Z_NULL || ds->prev == Z_NULL || ds->head == Z_NULL ||
        ds->pending_buf == Z_NULL) {
        deflateEnd (dest);
        return Z_MEM_ERROR;
    }
    /* following zmemcpy do not work for 16-bit MSDOS */
    zmemcpy(ds->window, ss->window, ds->w_size * 2 * sizeof(Byte));
    zmemcpy((voidpf)ds->prev, (voidpf)ss->prev, ds->w_size * sizeof(Pos));
    zmemcpy((voidpf)ds->head, (voidpf)ss->head, ds->hash_size * sizeof(Pos));
    zmemcpy(ds->pending_buf, ss->pending_buf, ds->lit_bufsize * LIT_BUFS);

    ds->pending_out = ds->pending_buf + (ss->pending_out - ss->pending_buf);
#ifdef LIT_MEM
    ds->d_buf = (ushf *)(ds->pending_buf + (ds->lit_bufsize << 1));
    ds->l_buf = ds->pending_buf + (ds->lit_bufsize << 2);
#else
    ds->sym_buf = ds->pending_buf + ds->lit_bufsize;
#endif

    ds->l_desc.dyn_tree = ds->dyn_ltree;
    ds->d_desc.dyn_tree = ds->dyn_dtree;
    ds->bl_desc.dyn_tree = ds->bl_tree;

    return Z_OK;
#endif /* MAXSEG_64K */
}